

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O3

void __thiscall async_unit_test::single(async_unit_test *this)

{
  ulong uVar1;
  ostream *poVar2;
  uint i;
  long lVar3;
  char local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running async test without error reporting\n",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  calls = calls + 1;
  cppcms::application::response();
  uVar1 = cppcms::http::response::out();
  lVar3 = 0;
  do {
    poVar2 = std::ostream::_M_insert<unsigned_long>(uVar1);
    local_30[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_30,1);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 100000);
  cppcms::application::release_context();
  cppcms::http::context::async_complete_response();
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void single()
	{
		std::cout << "Running async test without error reporting\n" << std::endl;
		calls ++;
		std::ostream &out = response().out();
		for(unsigned i=0;i<100000;i++) {
			out << i << '\n';
		}
		release_context()->async_complete_response();
	}